

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O0

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::resume_bfs
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte bVar1;
  value_type vVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  bool bVar6;
  reference pvVar7;
  reference pvVar8;
  byte *pbVar9;
  const_reference this_00;
  reference puVar10;
  uint *nxt;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  value_type cur;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dist_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *graph_local;
  vertex_t s_local;
  DynamicPartialIndex *this_local;
  
  this->back_ = 0;
  this->front_ = 0;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
  if (*pvVar7 != '?') {
    sVar5 = this->back_;
    this->back_ = sVar5 + 1;
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar5);
    *pvVar8 = s;
    while (this->back_ != this->front_) {
      sVar5 = this->front_;
      this->front_ = sVar5 + 1;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar5);
      uVar3 = *pvVar8;
      pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)uVar3);
      if (*pbVar9 < this->k_) {
        this_00 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::at(graph,(ulong)uVar3);
        __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
        nxt = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
        while (bVar6 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                           *)&nxt), bVar6) {
          puVar10 = __gnu_cxx::
                    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&__end2);
          pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (dist,(ulong)*puVar10);
          bVar1 = *pbVar9;
          pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)uVar3)
          ;
          if (*pbVar9 + 1 < (uint)bVar1) {
            pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (dist,(ulong)uVar3);
            vVar2 = *pvVar7;
            pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (dist,(ulong)*puVar10);
            *pvVar7 = vVar2 + '\x01';
            if (((this->isD2_ & 1U) == 0) || (bVar6 = indexed(&this->parent_->D1_,*puVar10), !bVar6)
               ) {
              uVar4 = *puVar10;
              sVar5 = this->back_;
              this->back_ = sVar5 + 1;
              pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 (this->queue_,sVar5);
              *pvVar8 = uVar4;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end2);
        }
      }
    }
    return;
  }
  __assert_fail("dist.at(s) != INF8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/DynamicScalableKReach.cpp"
                ,10,
                "void DynamicScalableKReach::DynamicPartialIndex::resume_bfs(vertex_t, const std::vector<std::vector<vertex_t>> &, std::vector<distance_t> &)"
               );
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::resume_bfs(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                            std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    assert(dist.at(s) != INF8);
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) <= dist.at(cur) + 1) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (!isD2_ || !parent_.D1_.indexed(nxt)) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}